

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this,Index except_index)

{
  char *__s;
  Offset OVar1;
  Expr *pEVar2;
  _func_int ***ppp_Var3;
  Result RVar4;
  Location loc;
  Location local_118;
  Var local_f0;
  Catch local_a8;
  
  local_118.field_1.field_0.line = 0;
  local_118.field_1.field_0.first_column = 0;
  local_118.field_1.field_0.last_column = 0;
  local_118.filename._M_len = 0;
  local_118.filename._M_str._0_4_ = 0;
  local_118.filename._M_str._4_4_ = 0;
  __s = this->filename_;
  local_118.filename._M_len = strlen(__s);
  local_118.filename._M_str._0_4_ = SUB84(__s,0);
  local_118.filename._M_str._4_4_ = (undefined4)((ulong)__s >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_118.field_1.field_0.line = (int)OVar1;
  local_118.field_1.field_0.first_column = (int)(OVar1 >> 0x20);
  Var::Var(&local_f0,except_index,&local_118);
  local_a8.loc.field_1.field_0.line = 0;
  local_a8.loc.field_1._4_8_ = 0;
  local_a8.loc.filename._M_len = 0;
  local_a8.loc.filename._M_str._0_4_ = 0;
  local_a8.loc.filename._M_str._4_4_ = 0;
  Var::Var(&local_a8.var,&local_f0);
  local_a8.exprs.first_ = (Expr *)0x0;
  local_a8.exprs.last_ = (Expr *)0x0;
  local_a8.exprs.size_ = 0;
  RVar4 = AppendCatch(this,&local_a8);
  pEVar2 = local_a8.exprs.first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var3 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  local_a8.exprs.first_ = (Expr *)0x0;
  local_a8.exprs.last_ = (Expr *)0x0;
  local_a8.exprs.size_ = 0;
  Var::~Var(&local_a8.var);
  Var::~Var(&local_f0);
  return (Result)RVar4.enum_;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr(Index except_index) {
  return AppendCatch(Catch(Var(except_index, GetLocation())));
}